

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,8ul>
::SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,8ul> *this,
          TypedID<(diligent_spirv_cross::Types)0> *arg_list_begin,
          TypedID<(diligent_spirv_cross::Types)0> *arg_list_end)

{
  size_t count_00;
  ulong local_30;
  size_t i;
  size_t count;
  TypedID<(diligent_spirv_cross::Types)0> *arg_list_end_local;
  TypedID<(diligent_spirv_cross::Types)0> *arg_list_begin_local;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL> *this_local;
  
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::SmallVector
            ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL> *)this
            );
  count_00 = (long)arg_list_end - (long)arg_list_begin >> 2;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::reserve
            ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL> *)this
             ,count_00);
  arg_list_end_local = arg_list_begin;
  for (local_30 = 0; local_30 < count_00; local_30 = local_30 + 1) {
    TypedID<(diligent_spirv_cross::Types)3>::TypedID
              ((TypedID<(diligent_spirv_cross::Types)3> *)(*(long *)this + local_30 * 4),
               arg_list_end_local);
    arg_list_end_local = arg_list_end_local + 1;
  }
  *(size_t *)(this + 8) = count_00;
  return;
}

Assistant:

SmallVector(const U *arg_list_begin, const U *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}